

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::address_of_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,string *expr)

{
  string *psVar1;
  ulong uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string local_70;
  spirv_cross local_4d [13];
  string local_40;
  string *local_20;
  string *expr_local;
  CompilerGLSL *this_local;
  
  local_20 = expr;
  expr_local = (string *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  uVar2 = ::std::__cxx11::string::size();
  if ((((3 < uVar2) &&
       (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)local_20), *pcVar3 == '(')) &&
      (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)local_20), *pcVar3 == '*')) &&
     (pcVar3 = (char *)::std::__cxx11::string::back(), psVar1 = local_20, *pcVar3 == ')')) {
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::substr((ulong)&local_40,(ulong)psVar1);
    enclose_expression(__return_storage_ptr__,this,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    return __return_storage_ptr__;
  }
  pcVar3 = (char *)::std::__cxx11::string::front();
  if (*pcVar3 == '*') {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_20);
  }
  else {
    local_4d[0] = (spirv_cross)0x26;
    enclose_expression(&local_70,this,local_20);
    join<char,std::__cxx11::string>(__return_storage_ptr__,local_4d,(char *)&local_70,in_RCX);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::address_of_expression(const std::string &expr)
{
	if (expr.size() > 3 && expr[0] == '(' && expr[1] == '*' && expr.back() == ')')
	{
		// If we have an expression which looks like (*foo), taking the address of it is the same as stripping
		// the first two and last characters. We might have to enclose the expression.
		// This doesn't work for cases like (*foo + 10),
		// but this is an r-value expression which we cannot take the address of anyways.
		return enclose_expression(expr.substr(2, expr.size() - 3));
	}
	else if (expr.front() == '*')
	{
		// If this expression starts with a dereference operator ('*'), then
		// just return the part after the operator.
		return expr.substr(1);
	}
	else
		return join('&', enclose_expression(expr));
}